

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O1

void __thiscall
cs::stack_type<cs_impl::any,std::allocator>::push<cs::pointer_const&>
          (stack_type<cs_impl::any,std::allocator> *this,pointer *args)

{
  any *this_00;
  error *this_01;
  string local_38;
  
  this_00 = *(any **)(this + 8);
  if ((long)this_00 - *(long *)this >> 3 != *(long *)(this + 0x20)) {
    *(any **)(this + 8) = this_00 + 1;
    cs_impl::any::any<cs::pointer>(this_00,args);
    return;
  }
  this_01 = (error *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"E000I","");
  cov::error::error(this_01,&local_38);
  __cxa_throw(this_01,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

inline void push(ArgsT &&...args)
		{
			if (full())
				throw cov::error("E000I");
			::new(m_current++) T(std::forward<ArgsT>(args)...);
		}